

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::HasExpressionArgs(Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,QuadTerms *qt)

{
  pair<std::pair<int,_int>,_double> *ppVar1;
  pair<std::pair<int,_int>,_double> v;
  pair<std::pair<int,_int>,_double> *__end2;
  pair<std::pair<int,_int>,_double> *__begin2;
  ArrayRef<std::pair<std::pair<int,_int>,_double>_> *__range2;
  int in_stack_ffffffffffffff4c;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  anon_struct_8_0_00000001_for___align this_00;
  int local_6c;
  pair<std::pair<int,_int>,_double> *local_50;
  undefined1 local_48 [40];
  type local_20 [2];
  
  this_00 = (anon_struct_8_0_00000001_for___align)local_48;
  QuadTerms::get_folded((QuadTerms *)this_00);
  local_20[0]._0_8_ = this_00;
  local_50 = ArrayRef<std::pair<std::pair<int,_int>,_double>_>::begin
                       ((ArrayRef<std::pair<std::pair<int,_int>,_double>_> *)0x1c1985);
  ppVar1 = ArrayRef<std::pair<std::pair<int,_int>,_double>_>::end
                     ((ArrayRef<std::pair<std::pair<int,_int>,_double>_> *)
                      CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
  do {
    if (local_50 == ppVar1) {
      local_6c = 2;
LAB_001c1a68:
      ArrayRef<std::pair<std::pair<int,_int>,_double>_>::~ArrayRef
                ((ArrayRef<std::pair<std::pair<int,_int>,_double>_> *)0x1c1a72);
      if (local_6c != 1) {
        local_20[1].__data[0xf] = 0;
      }
      return (bool)(local_20[1].__data[0xf] & 1);
    }
    in_stack_ffffffffffffff57 =
         FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                   ((FlatModel<mp::DefaultFlatModelParams> *)
                    CONCAT17(in_stack_ffffffffffffff57,
                             CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                    in_stack_ffffffffffffff4c);
    if ((!(bool)in_stack_ffffffffffffff57) ||
       (in_stack_ffffffffffffff56 =
             FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                       ((FlatModel<mp::DefaultFlatModelParams> *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                        in_stack_ffffffffffffff4c), !(bool)in_stack_ffffffffffffff56)) {
      local_20[1].__data[0xf] = 1;
      local_6c = 1;
      goto LAB_001c1a68;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool HasExpressionArgs(const QuadTerms& qt) const {
    for (auto v: qt.get_folded())
      if (!MPCD( IsProperVar(v.first.first) )
          || !MPCD( IsProperVar(v.first.second) ))
        return true;
    return false;
  }